

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Tokenizer::NextChar(Tokenizer *this)

{
  Tokenizer *this_local;
  
  if (this->current_char_ == '\n') {
    this->line_ = this->line_ + 1;
    this->column_ = 0;
  }
  else if (this->current_char_ == '\t') {
    this->column_ = (8 - this->column_ % 8) + this->column_;
  }
  else {
    this->column_ = this->column_ + 1;
  }
  this->buffer_pos_ = this->buffer_pos_ + 1;
  if (this->buffer_pos_ < this->buffer_size_) {
    this->current_char_ = this->buffer_[this->buffer_pos_];
  }
  else {
    Refresh(this);
  }
  return;
}

Assistant:

void Tokenizer::NextChar() {
  // Update our line and column counters based on the character being
  // consumed.
  if (current_char_ == '\n') {
    ++line_;
    column_ = 0;
  } else if (current_char_ == '\t') {
    column_ += kTabWidth - column_ % kTabWidth;
  } else {
    ++column_;
  }

  // Advance to the next character.
  ++buffer_pos_;
  if (buffer_pos_ < buffer_size_) {
    current_char_ = buffer_[buffer_pos_];
  } else {
    Refresh();
  }
}